

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O0

int tcu::TexVerifierUtil::wrap(WrapMode mode,int c,int size)

{
  int iVar1;
  int local_14;
  int size_local;
  int c_local;
  WrapMode mode_local;
  
  local_14 = c;
  switch(mode) {
  case CLAMP_TO_EDGE:
    c_local = deClamp32(c,0,size + -1);
    break;
  case CLAMP_TO_BORDER:
    c_local = deClamp32(c,-1,size);
    break;
  case REPEAT_GL:
  case REPEAT_CL:
    c_local = imod(c,size);
    break;
  case MIRRORED_ONCE:
    local_14 = deClamp32(c,-size,size);
  case MIRRORED_REPEAT_GL:
  case MIRRORED_REPEAT_CL:
    iVar1 = imod(local_14,size << 1);
    iVar1 = mirror(iVar1 - size);
    c_local = (size + -1) - iVar1;
    break;
  default:
    c_local = 0;
  }
  return c_local;
}

Assistant:

int wrap (Sampler::WrapMode mode, int c, int size)
{
	switch (mode)
	{
		// \note CL and GL modes are handled identically here, as verification process accounts for
		//		 accuracy differences caused by different methods (wrapping vs. denormalizing first).
		case tcu::Sampler::CLAMP_TO_BORDER:
			return deClamp32(c, -1, size);

		case tcu::Sampler::CLAMP_TO_EDGE:
			return deClamp32(c, 0, size-1);

		case tcu::Sampler::REPEAT_GL:
		case tcu::Sampler::REPEAT_CL:
			return imod(c, size);

		case tcu::Sampler::MIRRORED_ONCE:
			c = deClamp32(c, -size, size);
			// Fall-through

		case tcu::Sampler::MIRRORED_REPEAT_GL:
		case tcu::Sampler::MIRRORED_REPEAT_CL:
			return (size - 1) - mirror(imod(c, 2*size) - size);

		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}